

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# iutest_params_util.hpp
# Opt level: O0

void __thiscall
iutest::detail::IParamTestSuiteInfo::IParamTestSuiteInfo
          (IParamTestSuiteInfo *this,string *base_name,string *package_name)

{
  string *package_name_local;
  string *base_name_local;
  IParamTestSuiteInfo *this_local;
  
  this->_vptr_IParamTestSuiteInfo = (_func_int **)&PTR__IParamTestSuiteInfo_00178c60;
  std::
  vector<iutest::detail::IParamTestInfoData_*,_std::allocator<iutest::detail::IParamTestInfoData_*>_>
  ::vector(&this->m_testinfos);
  std::__cxx11::string::string((string *)&this->m_testsuite_base_name,(string *)base_name);
  std::__cxx11::string::string((string *)&this->m_package_name,(string *)package_name);
  return;
}

Assistant:

IParamTestSuiteInfo(const ::std::string& base_name, const ::std::string& package_name)
        : m_testsuite_base_name(base_name), m_package_name(package_name) {}